

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

void Kit_DsdTruthPartialTwo
               (Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,uint uSupp,int iVar,uint *pTruthCo,
               uint *pTruthDec)

{
  uint *pIn;
  
  pIn = Kit_DsdTruthComputeTwo(p,pNtk,uSupp,iVar,pTruthDec);
  if (pTruthCo != (uint *)0x0) {
    Kit_TruthCopy(pTruthCo,pIn,(uint)pNtk->nVars);
    return;
  }
  return;
}

Assistant:

void Kit_DsdTruthPartialTwo( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, unsigned uSupp, int iVar, unsigned * pTruthCo, unsigned * pTruthDec )
{
    unsigned * pTruth = Kit_DsdTruthComputeTwo( p, pNtk, uSupp, iVar, pTruthDec );
    if ( pTruthCo )
        Kit_TruthCopy( pTruthCo, pTruth, pNtk->nVars );
}